

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall ncnn::Net::load_param_bin(Net *this,DataReader *dr)

{
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar1;
  undefined8 *puVar2;
  int iVar3;
  pointer plVar4;
  layer_creator_func p_Var5;
  pointer pBVar6;
  iterator __position;
  int *piVar7;
  void *pvVar8;
  Allocator *pAVar9;
  pointer pMVar10;
  long *plVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  Net *pNVar15;
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *pvVar16;
  DataReader *pDVar17;
  int iVar18;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Layer *pLVar19;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *this_00;
  ulong uVar20;
  long lVar21;
  long lVar22;
  int *piVar23;
  int top_count;
  int bottom_count;
  int typeindex;
  int blob_count;
  int layer_count;
  int magic;
  Mat shape_hints;
  ParamDict pd;
  bool local_a15;
  int local_a14;
  int local_a10;
  int local_a0c;
  Mat local_a08;
  uint local_9c4;
  int local_9c0;
  int local_9bc;
  Layer *local_9b8;
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *local_9b0;
  Net *local_9a8;
  vector<int,_std::allocator<int>_> *local_9a0;
  int local_994;
  vector<int,_std::allocator<int>_> *local_990;
  Mat local_988;
  DataReader *local_940;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_938;
  ParamDict local_930;
  
  local_994 = 0;
  local_9a8 = this;
  iVar18 = (*dr->_vptr_DataReader[3])(dr,&local_994,4);
  if (CONCAT44(extraout_var,iVar18) == 4) {
    if (local_994 == 0x7685dd) {
      local_9bc = 0;
      local_9c0 = 0;
      iVar18 = (*dr->_vptr_DataReader[3])(dr,&local_9bc,4);
      if (CONCAT44(extraout_var_00,iVar18) == 4) {
        iVar18 = (*dr->_vptr_DataReader[3])(dr,&local_9c0,4);
        pNVar15 = local_9a8;
        if (CONCAT44(extraout_var_01,iVar18) == 4) {
          if ((0 < (long)local_9bc) && (0 < local_9c0)) {
            local_938 = &local_9a8->layers;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (local_938,(long)local_9bc);
            this_00 = &pNVar15->blobs;
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize(this_00,(long)local_9c0);
            ParamDict::ParamDict(&local_930);
            local_a0c = 0;
            local_a15 = 0 < local_9bc;
            pvVar16 = this_00;
            pDVar17 = dr;
            if (0 < local_9bc) {
              do {
                local_940 = pDVar17;
                local_9b0 = pvVar16;
                iVar18 = (*dr->_vptr_DataReader[3])(dr,&local_9c4,4);
                if (CONCAT44(extraout_var_02,iVar18) == 4) {
                  iVar18 = (*dr->_vptr_DataReader[3])(dr,&local_a10,4);
                  if (CONCAT44(extraout_var_03,iVar18) != 4) {
                    load_param_bin();
                    goto LAB_00123bc8;
                  }
                  iVar18 = (*dr->_vptr_DataReader[3])(dr,&local_a14,4);
                  if (CONCAT44(extraout_var_04,iVar18) != 4) {
                    load_param_bin();
                    goto LAB_00123bc8;
                  }
                  pLVar19 = create_layer(local_9c4);
                  if (pLVar19 == (Layer *)0x0) {
                    if ((int)local_9c4 < 0) {
LAB_001239b9:
                      pLVar19 = (Layer *)0x0;
                    }
                    else {
                      plVar4 = (local_9a8->custom_layer_registry).
                               super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      pLVar19 = (Layer *)0x0;
                      if ((ulong)(local_9c4 & 0xfffffeff) <
                          (ulong)((long)(local_9a8->custom_layer_registry).
                                        super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)plVar4 >>
                                 4)) {
                        p_Var5 = plVar4[local_9c4 & 0xfffffeff].creator;
                        if (p_Var5 == (layer_creator_func)0x0) goto LAB_001239b9;
                        pLVar19 = (*p_Var5)();
                      }
                    }
                  }
                  if (pLVar19 == (Layer *)0x0) {
                    fprintf(_stderr,"layer %d not exists or registered\n",(ulong)local_9c4);
                    uVar20 = 1;
                    clear(local_9a8);
                  }
                  else {
                    local_990 = &pLVar19->bottoms;
                    std::vector<int,_std::allocator<int>_>::resize(local_990,(long)local_a10);
                    bVar12 = 0 < local_a10;
                    uVar20 = 5;
                    local_9b8 = pLVar19;
                    if (0 < local_a10) {
                      lVar21 = 0;
                      do {
                        iVar18 = (*dr->_vptr_DataReader[3])(dr,&local_988,4);
                        if (CONCAT44(extraout_var_05,iVar18) == 4) {
                          pBVar6 = (this_00->
                                   super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                   _M_impl.super__Vector_impl_data._M_start;
                          __position._M_current =
                               pBVar6[(int)local_988.data].consumers.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish;
                          if (__position._M_current ==
                              pBVar6[(int)local_988.data].consumers.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage) {
                            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                      ((vector<int,std::allocator<int>> *)
                                       &pBVar6[(int)local_988.data].consumers,__position,&local_a0c)
                            ;
                          }
                          else {
                            *__position._M_current = local_a0c;
                            pBVar6[(int)local_988.data].consumers.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish = __position._M_current + 1;
                          }
                          (local_990->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[lVar21] = (int)local_988.data;
                        }
                        else {
                          load_param_bin();
                        }
                        if (CONCAT44(extraout_var_05,iVar18) != 4) {
                          uVar20 = 1;
                          break;
                        }
                        lVar21 = lVar21 + 1;
                        bVar12 = lVar21 < local_a10;
                      } while (lVar21 < local_a10);
                    }
                    if (!bVar12) {
                      local_9a0 = &local_9b8->tops;
                      std::vector<int,_std::allocator<int>_>::resize(local_9a0,(long)local_a14);
                      bVar12 = 0 < local_a14;
                      uVar20 = 8;
                      if (0 < local_a14) {
                        lVar21 = 0;
                        do {
                          iVar18 = (*dr->_vptr_DataReader[3])(dr,&local_988,4);
                          if (CONCAT44(extraout_var_06,iVar18) != 4) {
                            load_param_bin();
                            uVar20 = 1;
                            break;
                          }
                          (this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                          _M_impl.super__Vector_impl_data._M_start[(int)local_988.data].producer =
                               local_a0c;
                          (local_9a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[lVar21] = (int)local_988.data;
                          lVar21 = lVar21 + 1;
                          bVar12 = lVar21 < local_a14;
                        } while (lVar21 < local_a14);
                      }
                      if (!bVar12) {
                        iVar18 = ParamDict::load_param_bin(&local_930,dr);
                        if (iVar18 == 0) {
                          local_a08.elemsize._0_4_ = 0;
                          local_a08.elemsize._4_4_ = 0;
                          local_a08.elempack = 0;
                          local_a08.data = (void *)0x0;
                          local_a08.refcount._0_4_ = 0;
                          local_a08.refcount._4_4_ = 0;
                          local_a08.h = 0;
                          local_a08.c = 0;
                          local_a08.cstep = 0;
                          local_a08.allocator = (Allocator *)0x0;
                          local_a08.dims = 0;
                          local_a08.w = 0;
                          ParamDict::get(&local_988,&local_930,0x1e,&local_a08);
                          piVar23 = (int *)CONCAT44(local_a08.refcount._4_4_,
                                                    local_a08.refcount._0_4_);
                          if (piVar23 != (int *)0x0) {
                            LOCK();
                            *piVar23 = *piVar23 + -1;
                            UNLOCK();
                            if (*piVar23 == 0) {
                              if (local_a08.allocator == (Allocator *)0x0) {
                                if (local_a08.data != (void *)0x0) {
                                  free(local_a08.data);
                                }
                              }
                              else {
                                (**(code **)(*(long *)local_a08.allocator + 0x18))();
                              }
                            }
                          }
                          if (((local_988.data != (void *)0x0) &&
                              ((long)local_988.c * local_988.cstep != 0)) && (0 < local_a14)) {
                            piVar23 = (int *)((long)local_988.data + 8);
                            lVar21 = 0;
                            do {
                              iVar18 = (local_9a0->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_start[lVar21];
                              pBVar6 = (this_00->
                                       super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                       _M_impl.super__Vector_impl_data._M_start;
                              iVar3 = piVar23[-2];
                              if (iVar3 == 3) {
LAB_00123efe:
                                local_a08.w = piVar23[-1];
                                local_a08.h = piVar23[0];
                                local_a08.c = piVar23[1];
                                local_a08.data = (void *)0x0;
                                local_a08.refcount._0_4_ = 0;
                                local_a08.refcount._4_4_ = 0;
                                local_a08.elemsize._0_4_ = 4;
                                local_a08.elemsize._4_4_ = 0;
                                local_a08.elempack = 1;
                                local_a08.allocator = (Allocator *)0x0;
                                local_a08.dims = 3;
                                iVar3 = local_a08.dims;
                                local_a08.dims = 3;
                                local_a08.cstep =
                                     (long)(local_a08.h * local_a08.w) + 3U & 0x3ffffffffffffffc;
                                if (&pBVar6[iVar18].shape != &local_a08) {
                                  piVar7 = pBVar6[iVar18].shape.refcount;
                                  if (piVar7 != (int *)0x0) {
                                    LOCK();
                                    *piVar7 = *piVar7 + -1;
                                    UNLOCK();
                                    if (*piVar7 == 0) {
                                      pvVar8 = pBVar6[iVar18].shape.data;
                                      pAVar9 = pBVar6[iVar18].shape.allocator;
                                      if (pAVar9 == (Allocator *)0x0) {
                                        if (pvVar8 != (void *)0x0) {
                                          free(pvVar8);
                                        }
                                      }
                                      else {
                                        (**(code **)(*(long *)pAVar9 + 0x18))();
                                      }
                                    }
                                  }
                                  *(undefined8 *)((long)&pBVar6[iVar18].shape.refcount + 4) = 0;
                                  *(undefined8 *)((long)&pBVar6[iVar18].shape.elemsize + 4) = 0;
                                  pBVar6[iVar18].shape.data = (void *)0x0;
                                  pBVar6[iVar18].shape.refcount = (int *)0x0;
                                  pBVar6[iVar18].shape.dims = 0;
                                  pBVar6[iVar18].shape.w = 0;
                                  pBVar6[iVar18].shape.h = 0;
                                  pBVar6[iVar18].shape.c = 0;
                                  pBVar6[iVar18].shape.cstep = 0;
                                  pBVar6[iVar18].shape.data = local_a08.data;
                                  pBVar6[iVar18].shape.refcount =
                                       (int *)CONCAT44(local_a08.refcount._4_4_,
                                                       local_a08.refcount._0_4_);
                                  pBVar6[iVar18].shape.elemsize =
                                       CONCAT44(local_a08.elemsize._4_4_,
                                                (undefined4)local_a08.elemsize);
                                  pBVar6[iVar18].shape.elempack = local_a08.elempack;
                                  pBVar6[iVar18].shape.allocator = local_a08.allocator;
                                  pBVar6[iVar18].shape.dims = local_a08.dims;
                                  pBVar6[iVar18].shape.w = local_a08.w;
                                  pBVar6[iVar18].shape.h = local_a08.h;
                                  pBVar6[iVar18].shape.c = local_a08.c;
                                  pBVar6[iVar18].shape.cstep = local_a08.cstep;
                                  iVar3 = local_a08.dims;
                                }
                                local_a08.dims = iVar3;
                                this_00 = local_9b0;
                                piVar7 = (int *)CONCAT44(local_a08.refcount._4_4_,
                                                         local_a08.refcount._0_4_);
                                if (piVar7 != (int *)0x0) {
                                  LOCK();
                                  *piVar7 = *piVar7 + -1;
                                  UNLOCK();
                                  if (*piVar7 == 0) {
                                    if (local_a08.allocator == (Allocator *)0x0) {
                                      if (local_a08.data != (void *)0x0) {
                                        free(local_a08.data);
                                      }
                                    }
                                    else {
                                      (**(code **)(*(long *)local_a08.allocator + 0x18))();
                                    }
                                  }
                                }
                              }
                              else if (iVar3 == 2) {
                                local_a08.w = piVar23[-1];
                                local_a08.h = *piVar23;
                                local_a08.data = (void *)0x0;
                                local_a08.refcount._0_4_ = 0;
                                local_a08.refcount._4_4_ = 0;
                                local_a08.elemsize._0_4_ = 4;
                                local_a08.elemsize._4_4_ = 0;
                                local_a08.elempack = 1;
                                local_a08.allocator = (Allocator *)0x0;
                                local_a08.dims = 2;
                                iVar13 = local_a08.dims;
                                local_a08.dims = 2;
                                local_a08.c = 1;
                                local_a08.cstep = (size_t)(local_a08.h * local_a08.w);
                                if (&pBVar6[iVar18].shape != &local_a08) {
                                  piVar7 = pBVar6[iVar18].shape.refcount;
                                  if (piVar7 != (int *)0x0) {
                                    LOCK();
                                    *piVar7 = *piVar7 + -1;
                                    UNLOCK();
                                    if (*piVar7 == 0) {
                                      pvVar8 = pBVar6[iVar18].shape.data;
                                      pAVar9 = pBVar6[iVar18].shape.allocator;
                                      if (pAVar9 == (Allocator *)0x0) {
                                        if (pvVar8 != (void *)0x0) {
                                          free(pvVar8);
                                        }
                                      }
                                      else {
                                        (**(code **)(*(long *)pAVar9 + 0x18))();
                                      }
                                    }
                                  }
                                  *(undefined8 *)((long)&pBVar6[iVar18].shape.refcount + 4) = 0;
                                  *(undefined8 *)((long)&pBVar6[iVar18].shape.elemsize + 4) = 0;
                                  pBVar6[iVar18].shape.data = (void *)0x0;
                                  pBVar6[iVar18].shape.refcount = (int *)0x0;
                                  pBVar6[iVar18].shape.dims = 0;
                                  pBVar6[iVar18].shape.w = 0;
                                  pBVar6[iVar18].shape.h = 0;
                                  pBVar6[iVar18].shape.c = 0;
                                  pBVar6[iVar18].shape.cstep = 0;
                                  pBVar6[iVar18].shape.data = local_a08.data;
                                  pBVar6[iVar18].shape.refcount =
                                       (int *)CONCAT44(local_a08.refcount._4_4_,
                                                       local_a08.refcount._0_4_);
                                  pBVar6[iVar18].shape.elemsize =
                                       CONCAT44(local_a08.elemsize._4_4_,
                                                (undefined4)local_a08.elemsize);
                                  pBVar6[iVar18].shape.elempack = local_a08.elempack;
                                  pBVar6[iVar18].shape.allocator = local_a08.allocator;
                                  pBVar6[iVar18].shape.dims = local_a08.dims;
                                  pBVar6[iVar18].shape.w = local_a08.w;
                                  pBVar6[iVar18].shape.h = local_a08.h;
                                  pBVar6[iVar18].shape.c = local_a08.c;
                                  pBVar6[iVar18].shape.cstep = local_a08.cstep;
                                  iVar13 = local_a08.dims;
                                }
                                local_a08.dims = iVar13;
                                this_00 = local_9b0;
                                piVar7 = (int *)CONCAT44(local_a08.refcount._4_4_,
                                                         local_a08.refcount._0_4_);
                                if (piVar7 != (int *)0x0) {
                                  LOCK();
                                  *piVar7 = *piVar7 + -1;
                                  UNLOCK();
                                  if (*piVar7 == 0) {
                                    if (local_a08.allocator == (Allocator *)0x0) {
                                      if (local_a08.data != (void *)0x0) {
                                        free(local_a08.data);
                                      }
                                    }
                                    else {
                                      (**(code **)(*(long *)local_a08.allocator + 0x18))();
                                    }
                                  }
                                }
LAB_00123ef4:
                                if (iVar3 == 3) goto LAB_00123efe;
                              }
                              else if (iVar3 == 1) {
                                local_a08.w = piVar23[-1];
                                local_a08.cstep = (size_t)local_a08.w;
                                local_a08.data = (void *)0x0;
                                local_a08.refcount._0_4_ = 0;
                                local_a08.refcount._4_4_ = 0;
                                local_a08.elemsize._0_4_ = 4;
                                local_a08.elemsize._4_4_ = 0;
                                local_a08.elempack = 1;
                                local_a08.allocator = (Allocator *)0x0;
                                local_a08.dims = 1;
                                iVar13 = local_a08.dims;
                                local_a08.dims = 1;
                                local_a08.h = 1;
                                local_a08.c = 1;
                                if (&pBVar6[iVar18].shape != &local_a08) {
                                  piVar7 = pBVar6[iVar18].shape.refcount;
                                  if (piVar7 != (int *)0x0) {
                                    LOCK();
                                    *piVar7 = *piVar7 + -1;
                                    UNLOCK();
                                    if (*piVar7 == 0) {
                                      pvVar8 = pBVar6[iVar18].shape.data;
                                      pAVar9 = pBVar6[iVar18].shape.allocator;
                                      if (pAVar9 == (Allocator *)0x0) {
                                        if (pvVar8 != (void *)0x0) {
                                          free(pvVar8);
                                        }
                                      }
                                      else {
                                        (**(code **)(*(long *)pAVar9 + 0x18))();
                                      }
                                    }
                                  }
                                  *(undefined8 *)((long)&pBVar6[iVar18].shape.refcount + 4) = 0;
                                  *(undefined8 *)((long)&pBVar6[iVar18].shape.elemsize + 4) = 0;
                                  pBVar6[iVar18].shape.data = (void *)0x0;
                                  pBVar6[iVar18].shape.refcount = (int *)0x0;
                                  pBVar6[iVar18].shape.dims = 0;
                                  pBVar6[iVar18].shape.w = 0;
                                  pBVar6[iVar18].shape.h = 0;
                                  pBVar6[iVar18].shape.c = 0;
                                  pBVar6[iVar18].shape.cstep = 0;
                                  pBVar6[iVar18].shape.data = local_a08.data;
                                  pBVar6[iVar18].shape.refcount =
                                       (int *)CONCAT44(local_a08.refcount._4_4_,
                                                       local_a08.refcount._0_4_);
                                  pBVar6[iVar18].shape.elemsize =
                                       CONCAT44(local_a08.elemsize._4_4_,
                                                (undefined4)local_a08.elemsize);
                                  pBVar6[iVar18].shape.elempack = local_a08.elempack;
                                  pBVar6[iVar18].shape.allocator = local_a08.allocator;
                                  pBVar6[iVar18].shape.dims = local_a08.dims;
                                  pBVar6[iVar18].shape.w = local_a08.w;
                                  pBVar6[iVar18].shape.h = local_a08.h;
                                  pBVar6[iVar18].shape.c = local_a08.c;
                                  pBVar6[iVar18].shape.cstep = local_a08.cstep;
                                  iVar13 = local_a08.dims;
                                }
                                local_a08.dims = iVar13;
                                this_00 = local_9b0;
                                piVar7 = (int *)CONCAT44(local_a08.refcount._4_4_,
                                                         local_a08.refcount._0_4_);
                                if (piVar7 != (int *)0x0) {
                                  LOCK();
                                  *piVar7 = *piVar7 + -1;
                                  UNLOCK();
                                  if (*piVar7 == 0) {
                                    if (local_a08.allocator == (Allocator *)0x0) {
                                      if (local_a08.data != (void *)0x0) {
                                        free(local_a08.data);
                                      }
                                    }
                                    else {
                                      (**(code **)(*(long *)local_a08.allocator + 0x18))();
                                    }
                                  }
                                }
                                goto LAB_00123ef4;
                              }
                              lVar21 = lVar21 + 1;
                              piVar23 = piVar23 + 4;
                            } while (lVar21 < local_a14);
                          }
                          local_a08.elempack = 0;
                          local_a08.elemsize._4_4_ = 0;
                          local_a08.elemsize._0_4_ = 0;
                          local_a08.refcount._4_4_ = 0;
                          local_a08.refcount._0_4_ = 0;
                          local_a08.cstep = 0;
                          local_a08.h = 0;
                          local_a08.c = 0;
                          local_a08.dims = 0;
                          local_a08.w = 0;
                          local_a08.data = (void *)0x0;
                          pvVar1 = &local_9b8->bottom_shapes;
                          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                                    (pvVar1,(long)local_a10);
                          if (0 < local_a10) {
                            lVar22 = 0;
                            lVar21 = 0;
                            do {
                              iVar18 = (local_990->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_start[lVar21];
                              pBVar6 = (this_00->
                                       super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                       _M_impl.super__Vector_impl_data._M_start;
                              pMVar10 = (pvVar1->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_start;
                              puVar2 = (undefined8 *)((long)&pMVar10->data + lVar22);
                              if ((Mat *)puVar2 != &pBVar6[iVar18].shape) {
                                piVar23 = pBVar6[iVar18].shape.refcount;
                                if (piVar23 != (int *)0x0) {
                                  LOCK();
                                  *piVar23 = *piVar23 + 1;
                                  UNLOCK();
                                }
                                piVar23 = *(int **)((long)&pMVar10->refcount + lVar22);
                                if (piVar23 != (int *)0x0) {
                                  LOCK();
                                  *piVar23 = *piVar23 + -1;
                                  UNLOCK();
                                  if (*piVar23 == 0) {
                                    pvVar8 = *(void **)((long)&pMVar10->data + lVar22);
                                    plVar11 = *(long **)((long)&pMVar10->allocator + lVar22);
                                    if (plVar11 == (long *)0x0) {
                                      if (pvVar8 != (void *)0x0) {
                                        free(pvVar8);
                                      }
                                    }
                                    else {
                                      (**(code **)(*plVar11 + 0x18))();
                                    }
                                  }
                                }
                                *(undefined8 *)((long)puVar2 + 0xc) = 0;
                                *(undefined8 *)((long)puVar2 + 0x14) = 0;
                                *puVar2 = 0;
                                puVar2[1] = 0;
                                puVar2 = (undefined8 *)((long)&pMVar10->dims + lVar22);
                                *puVar2 = 0;
                                puVar2[1] = 0;
                                *(undefined8 *)((long)&pMVar10->cstep + lVar22) = 0;
                                piVar23 = pBVar6[iVar18].shape.refcount;
                                puVar2 = (undefined8 *)((long)&pMVar10->data + lVar22);
                                *puVar2 = pBVar6[iVar18].shape.data;
                                puVar2[1] = piVar23;
                                *(size_t *)((long)&pMVar10->elemsize + lVar22) =
                                     pBVar6[iVar18].shape.elemsize;
                                *(int *)((long)&pMVar10->elempack + lVar22) =
                                     pBVar6[iVar18].shape.elempack;
                                *(Allocator **)((long)&pMVar10->allocator + lVar22) =
                                     pBVar6[iVar18].shape.allocator;
                                iVar3 = pBVar6[iVar18].shape.w;
                                iVar13 = pBVar6[iVar18].shape.h;
                                iVar14 = pBVar6[iVar18].shape.c;
                                piVar23 = (int *)((long)&pMVar10->dims + lVar22);
                                *piVar23 = pBVar6[iVar18].shape.dims;
                                piVar23[1] = iVar3;
                                piVar23[2] = iVar13;
                                piVar23[3] = iVar14;
                                *(size_t *)((long)&pMVar10->cstep + lVar22) =
                                     pBVar6[iVar18].shape.cstep;
                              }
                              lVar21 = lVar21 + 1;
                              lVar22 = lVar22 + 0x40;
                              this_00 = local_9b0;
                            } while (lVar21 < local_a10);
                          }
                          pvVar1 = &local_9b8->top_shapes;
                          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                                    (pvVar1,(long)local_a14);
                          if (0 < local_a14) {
                            lVar22 = 0;
                            lVar21 = 0;
                            do {
                              iVar18 = (local_9a0->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_start[lVar21];
                              pBVar6 = (this_00->
                                       super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                       _M_impl.super__Vector_impl_data._M_start;
                              pMVar10 = (pvVar1->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_start;
                              puVar2 = (undefined8 *)((long)&pMVar10->data + lVar22);
                              if ((Mat *)puVar2 != &pBVar6[iVar18].shape) {
                                piVar23 = pBVar6[iVar18].shape.refcount;
                                if (piVar23 != (int *)0x0) {
                                  LOCK();
                                  *piVar23 = *piVar23 + 1;
                                  UNLOCK();
                                }
                                piVar23 = *(int **)((long)&pMVar10->refcount + lVar22);
                                if (piVar23 != (int *)0x0) {
                                  LOCK();
                                  *piVar23 = *piVar23 + -1;
                                  UNLOCK();
                                  if (*piVar23 == 0) {
                                    pvVar8 = *(void **)((long)&pMVar10->data + lVar22);
                                    plVar11 = *(long **)((long)&pMVar10->allocator + lVar22);
                                    if (plVar11 == (long *)0x0) {
                                      if (pvVar8 != (void *)0x0) {
                                        free(pvVar8);
                                      }
                                    }
                                    else {
                                      (**(code **)(*plVar11 + 0x18))();
                                    }
                                  }
                                }
                                *(undefined8 *)((long)puVar2 + 0xc) = 0;
                                *(undefined8 *)((long)puVar2 + 0x14) = 0;
                                *puVar2 = 0;
                                puVar2[1] = 0;
                                puVar2 = (undefined8 *)((long)&pMVar10->dims + lVar22);
                                *puVar2 = 0;
                                puVar2[1] = 0;
                                *(undefined8 *)((long)&pMVar10->cstep + lVar22) = 0;
                                piVar23 = pBVar6[iVar18].shape.refcount;
                                puVar2 = (undefined8 *)((long)&pMVar10->data + lVar22);
                                *puVar2 = pBVar6[iVar18].shape.data;
                                puVar2[1] = piVar23;
                                *(size_t *)((long)&pMVar10->elemsize + lVar22) =
                                     pBVar6[iVar18].shape.elemsize;
                                *(int *)((long)&pMVar10->elempack + lVar22) =
                                     pBVar6[iVar18].shape.elempack;
                                *(Allocator **)((long)&pMVar10->allocator + lVar22) =
                                     pBVar6[iVar18].shape.allocator;
                                iVar3 = pBVar6[iVar18].shape.w;
                                iVar13 = pBVar6[iVar18].shape.h;
                                iVar14 = pBVar6[iVar18].shape.c;
                                piVar23 = (int *)((long)&pMVar10->dims + lVar22);
                                *piVar23 = pBVar6[iVar18].shape.dims;
                                piVar23[1] = iVar3;
                                piVar23[2] = iVar13;
                                piVar23[3] = iVar14;
                                *(size_t *)((long)&pMVar10->cstep + lVar22) =
                                     pBVar6[iVar18].shape.cstep;
                              }
                              lVar21 = lVar21 + 1;
                              lVar22 = lVar22 + 0x40;
                              this_00 = local_9b0;
                            } while (lVar21 < local_a14);
                          }
                          pLVar19 = local_9b8;
                          iVar18 = (*local_9b8->_vptr_Layer[2])(local_9b8,&local_930);
                          dr = local_940;
                          if (iVar18 == 0) {
                            (local_938->
                            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                            _M_impl.super__Vector_impl_data._M_start[local_a0c] = pLVar19;
                          }
                          else {
                            load_param_bin();
                          }
                          uVar20 = 0;
                          piVar23 = (int *)CONCAT44(local_988.refcount._4_4_,
                                                    local_988.refcount._0_4_);
                          if (piVar23 != (int *)0x0) {
                            LOCK();
                            *piVar23 = *piVar23 + -1;
                            UNLOCK();
                            if (*piVar23 == 0) {
                              if (local_988.allocator == (Allocator *)0x0) {
                                if (local_988.data != (void *)0x0) {
                                  free(local_988.data);
                                }
                              }
                              else {
                                (**(code **)(*(long *)local_988.allocator + 0x18))();
                              }
                            }
                          }
                          local_988.elemsize._0_4_ = 0;
                          local_988._20_8_ = 0;
                          local_988.data = (void *)0x0;
                          local_988.refcount._0_4_ = 0;
                          local_988.refcount._4_4_ = 0;
                          local_988.dims = 0;
                          local_988.w = 0;
                          local_988.h = 0;
                          local_988.c = 0;
                          local_988.cstep = 0;
                        }
                        else {
                          load_param_bin();
                          uVar20 = 0;
                        }
                      }
                    }
                  }
                }
                else {
                  load_param_bin();
LAB_00123bc8:
                  uVar20 = 1;
                }
                if ((uVar20 & 0xb) != 0) break;
                local_a0c = local_a0c + 1;
                local_a15 = local_a0c < local_9bc;
                pvVar16 = local_9b0;
                pDVar17 = local_940;
              } while (local_a0c < local_9bc);
            }
            lVar21 = 0x8c0;
            do {
              piVar23 = *(int **)((long)&local_930.params[0].v.data + lVar21);
              if (piVar23 != (int *)0x0) {
                LOCK();
                *piVar23 = *piVar23 + -1;
                UNLOCK();
                if (*piVar23 == 0) {
                  pvVar8 = *(void **)((long)&local_930.params[0].type + lVar21);
                  plVar11 = *(long **)((long)&local_930.params[0].v.elempack + lVar21);
                  if (plVar11 == (long *)0x0) {
                    if (pvVar8 != (void *)0x0) {
                      free(pvVar8);
                    }
                  }
                  else {
                    (**(code **)(*plVar11 + 0x18))();
                  }
                }
              }
              *(undefined8 *)((long)&local_930.params[0].v.data + lVar21 + 4) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar21 + 4) = 0;
              *(undefined8 *)((long)&local_930.params[0].type + lVar21) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.data + lVar21) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar21) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.dims + lVar21) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.h + lVar21) = 0;
              lVar21 = lVar21 + -0x48;
            } while (lVar21 != -0x40);
            return -(uint)local_a15;
          }
          load_param_bin();
        }
        else {
          load_param_bin();
        }
      }
      else {
        load_param_bin();
      }
    }
    else {
      load_param_bin();
    }
  }
  else {
    load_param_bin();
  }
  return -1;
}

Assistant:

int Net::load_param_bin(const DataReader& dr)
{
#define READ_VALUE(buf) \
    if (dr.read(&buf, sizeof(buf)) != sizeof(buf)) \
    { \
        fprintf(stderr, "read " #buf " failed\n"); \
        return -1; \
    }

    int magic = 0;
    READ_VALUE(magic)
    if (magic != 7767517)
    {
        fprintf(stderr, "param is too old, please regenerate\n");
        return -1;
    }

    int layer_count = 0;
    int blob_count = 0;
    READ_VALUE(layer_count)
    READ_VALUE(blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        fprintf(stderr, "invalid layer_count or blob_count\n");
        return -1;
    }

    layers.resize(layer_count);
    blobs.resize(blob_count);

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        if (!vkdev) vkdev = get_gpu_device();
        if (!vkdev) opt.use_vulkan_compute = false;// no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!vkdev->info.support_fp16_packed) opt.use_fp16_packed = false;
        if (!vkdev->info.support_fp16_storage) opt.use_fp16_storage = false;
        if (!vkdev->info.support_fp16_arithmetic) opt.use_fp16_arithmetic = false;
        if (!vkdev->info.support_int8_storage) opt.use_int8_storage = false;
        if (!vkdev->info.support_int8_arithmetic) opt.use_int8_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i=0; i<layer_count; i++)
    {
        int typeindex;
        int bottom_count;
        int top_count;
        READ_VALUE(typeindex)
        READ_VALUE(bottom_count)
        READ_VALUE(top_count)

        Layer* layer = create_layer(typeindex);
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            fprintf(stderr, "layer %d not exists or registered\n", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = vkdev;
#endif // NCNN_VULKAN

//         layer->type = std::string(layer_type);
//         layer->name = std::string(layer_name);
//         fprintf(stderr, "new layer %d\n", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j=0; j<bottom_count; j++)
        {
            int bottom_blob_index;
            READ_VALUE(bottom_blob_index)

            Blob& blob = blobs[bottom_blob_index];

            blob.consumers.push_back(i);

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            int top_blob_index;
            READ_VALUE(top_blob_index)

            Blob& blob = blobs[top_blob_index];

//             blob.name = std::string(blob_name);
//             fprintf(stderr, "new blob %s\n", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        // layer specific params
        int pdlr = pd.load_param_bin(dr);
        if (pdlr != 0)
        {
            fprintf(stderr, "ParamDict load_param failed\n");
            continue;
        }

        // pull out top blob shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j=0; j<top_count; j++)
            {
                Blob& blob = blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j=0; j<bottom_count; j++)
        {
            layer->bottom_shapes[j] = blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            layer->top_shapes[j] = blobs[layer->tops[j]].shape;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            fprintf(stderr, "layer load_param failed\n");
            continue;
        }

        layers[i] = layer;
    }

#undef READ_VALUE
    return 0;
}